

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_> * __thiscall
GameEngine::getLightPlayers
          (vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>
           *__return_storage_ptr__,GameEngine *this)

{
  pointer psVar1;
  pointer psVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->players).
                super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    std::make_shared<LightPlayer,Player&>((Player *)&stack0xffffffffffffffc8);
    std::vector<std::shared_ptr<LightPlayer>,std::allocator<std::shared_ptr<LightPlayer>>>::
    emplace_back<std::shared_ptr<LightPlayer>>
              ((vector<std::shared_ptr<LightPlayer>,std::allocator<std::shared_ptr<LightPlayer>>> *)
               __return_storage_ptr__,(shared_ptr<LightPlayer> *)&stack0xffffffffffffffc8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<LightPlayer> > GameEngine::getLightPlayers() {
  std::vector<std::shared_ptr<LightPlayer> > lightPlayers;

  for (const auto &player : players) {
    lightPlayers.push_back(std::make_shared<LightPlayer>(*player));
  }

  return lightPlayers;
}